

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

void __thiscall Shell::Options::output(Options *this,ostream *str)

{
  Iterator it;
  Iterator i2;
  Iterator i1;
  bool bVar1;
  byte bVar2;
  OptionTag OVar3;
  Stack<Shell::Options::AbstractOptionValue_*> *this_00;
  ostream *poVar4;
  ulong uVar5;
  void *pvVar6;
  AbstractOptionValue *pAVar7;
  ostream *in_RSI;
  Options *in_RDI;
  bool experimental;
  bool normalshow;
  int i_1;
  VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sit;
  int i;
  AbstractOptionValue *option_1;
  int num_tags;
  VirtualIterator<Shell::Options::AbstractOptionValue_*> options;
  AbstractOptionValue *option;
  uint tag;
  Mode this_mode;
  DArray<Shell::Options::AbstractOptionValue_*> osa;
  string br;
  string label;
  Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_> groups;
  string name;
  Iterator oit;
  string br_gap;
  Stack<Shell::Options::AbstractOptionValue_*> os;
  Stack<Shell::Options::AbstractOptionValue_*> stack;
  string first;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sim_l;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sim_s;
  ValueNotFoundException *anon_var_0_1;
  ValueNotFoundException *anon_var_0;
  stringstream vs;
  AbstractOptionValue *in_stack_fffffffffffffa98;
  Stack<Shell::Options::AbstractOptionValue_*> *in_stack_fffffffffffffaa0;
  Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_> *in_stack_fffffffffffffaa8;
  LookupWrapper *in_stack_fffffffffffffab0;
  Options *in_stack_fffffffffffffab8;
  allocator<char> local_527;
  byte local_526;
  byte local_525;
  int local_524;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  int iVar8;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffafc;
  int iVar9;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffb00;
  CatIterator<Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Iterator,_Lib::IterTraits<Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Iterator>_>
  in_stack_fffffffffffffb20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_> local_488;
  string local_468 [32];
  Iterator local_448 [4];
  string local_408 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8 [3];
  string local_348 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  string local_2e8 [32];
  string local_2c8 [32];
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_2a8;
  string local_288 [32];
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_268 [2];
  string local_218 [32];
  AbstractOptionValue *local_1f8;
  Stack<Shell::Options::AbstractOptionValue_*> *pSStack_1f0;
  Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_> *local_1e8;
  LookupWrapper *pLStack_1e0;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  undefined1 auStack_1a0 [384];
  
  bVar1 = printAllTheoryAxioms(in_RDI);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Sorry, not implemented yet!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    explainOption_abi_cxx11_((Options *)0x59fc37);
    bVar2 = std::__cxx11::string::empty();
    std::__cxx11::string::~string(local_1d0);
    if (((bVar2 ^ 0xff) & 1) != 0) {
      explainOption_abi_cxx11_((Options *)0x59fc76);
      std::__cxx11::string::string(local_218,local_468);
      pAVar7 = LookupWrapper::findLong
                         (in_stack_fffffffffffffab0,(string *)in_stack_fffffffffffffab8);
      std::__cxx11::string::~string(local_218);
      if (pAVar7 == (AbstractOptionValue *)0x0) {
        poVar4 = std::operator<<(in_RSI,local_468);
        poVar4 = std::operator<<(poVar4," not a known option");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::string(local_288,local_468);
        getSimilarOptionNames(in_stack_fffffffffffffab8,(string *)in_stack_fffffffffffffb00,false);
        std::__cxx11::string::~string(local_288);
        std::__cxx11::string::string(local_2c8,local_468);
        getSimilarOptionNames(in_stack_fffffffffffffab8,(string *)in_stack_fffffffffffffb00,false);
        std::__cxx11::string::~string(local_2c8);
        Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Iterator::Iterator
                  ((Iterator *)in_stack_fffffffffffffaa0,
                   (Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffa98);
        Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Iterator::Iterator
                  ((Iterator *)in_stack_fffffffffffffaa0,
                   (Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffa98);
        i1.super_RefIterator._pointer._4_4_ = in_stack_fffffffffffffafc;
        i1.super_RefIterator._pointer._0_4_ = in_stack_fffffffffffffaf8;
        i1.super_RefIterator._stack = in_stack_fffffffffffffb00;
        i2.super_RefIterator._pointer._4_4_ = in_stack_fffffffffffffaec;
        i2.super_RefIterator._pointer._0_4_ = in_stack_fffffffffffffae8;
        i2.super_RefIterator._stack = in_stack_fffffffffffffaf0;
        Lib::
        concatIters<Lib::Stack<std::__cxx11::string>::Iterator,Lib::Stack<std::__cxx11::string>::Iterator>
                  (i1,i2);
        Lib::
        pvi<Lib::IterTraits<Lib::CatIterator<Lib::Stack<std::__cxx11::string>::Iterator,Lib::IterTraits<Lib::Stack<std::__cxx11::string>::Iterator>>>>
                  ((IterTraits<Lib::CatIterator<Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Iterator,_Lib::IterTraits<Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Iterator>_>_>
                    )in_stack_fffffffffffffb20);
        bVar1 = Lib::
                VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::hasNext((VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x59feeb);
        in_stack_fffffffffffffa98 = local_1f8;
        in_stack_fffffffffffffaa0 = pSStack_1f0;
        in_stack_fffffffffffffaa8 = local_1e8;
        in_stack_fffffffffffffab0 = pLStack_1e0;
        if (bVar1) {
          Lib::
          VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::next((VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x59ff08);
          std::operator<<(in_RSI,"\tMaybe you meant ");
          bVar1 = Lib::
                  VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::hasNext((VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x59ff27);
          in_stack_fffffffffffffa98 = local_1f8;
          in_stack_fffffffffffffaa0 = pSStack_1f0;
          in_stack_fffffffffffffaa8 = local_1e8;
          in_stack_fffffffffffffab0 = pLStack_1e0;
          if (bVar1) {
            std::operator<<(in_RSI,"one of:\n\t\t");
            in_stack_fffffffffffffa98 = local_1f8;
            in_stack_fffffffffffffaa0 = pSStack_1f0;
            in_stack_fffffffffffffaa8 = local_1e8;
            in_stack_fffffffffffffab0 = pLStack_1e0;
          }
          std::operator<<(in_RSI,local_2e8);
          while (bVar1 = Lib::
                         VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::hasNext((VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)0x5a002a), bVar1) {
            Lib::
            VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::next((VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x5a004c);
            std::operator+(&local_308,"\n\t\t",&local_328);
            std::operator<<(in_RSI,(string *)&local_308);
            std::__cxx11::string::~string((string *)&local_308);
            std::__cxx11::string::~string((string *)&local_328);
          }
          std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_2e8);
        }
        Lib::
        VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~VirtualIterator((VirtualIterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x5a0110);
        Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Stack(&local_2a8);
        Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Stack(local_268);
      }
      else {
        std::__cxx11::stringstream::stringstream(local_1b0);
        bVar1 = lineWrapInShowOptions(in_RDI);
        (*pAVar7->_vptr_AbstractOptionValue[7])(pAVar7,auStack_1a0,(ulong)bVar1);
        std::__cxx11::stringstream::str();
        std::operator<<(in_RSI,local_348);
        std::__cxx11::string::~string(local_348);
        std::__cxx11::stringstream::~stringstream(local_1b0);
      }
      std::__cxx11::string::~string(local_468);
    }
    bVar1 = showHelp(in_RDI);
    if (bVar1) {
      std::operator<<(in_RSI,"=========== Usage ==========\n");
      std::operator<<(in_RSI,"Call vampire using\n");
      std::operator<<(in_RSI,"  vampire [options] [problem]\n");
      std::operator<<(in_RSI,"For example,\n");
      std::operator<<(in_RSI,
                      "  vampire --mode casc --include ~/TPTP ~/TPTP/Problems/ALG/ALG150+1.p\n");
      std::operator<<(in_RSI,"=========== Hints ==========\n");
      std::operator<<(in_RSI,"=========== Options ==========\n");
      std::operator<<(in_RSI,"To see a list of all options use\n  --show_options on\n");
      std::operator<<(in_RSI,
                      "Options will only be displayed for the current mode (Vampire by default)\n");
      std::operator<<(in_RSI," use --mode to change mode\n");
      std::operator<<(in_RSI,"=========== End ==========\n");
    }
    local_525 = showOptions(in_RDI);
    local_526 = showExperimentalOptions(in_RDI);
    if (((local_525 & 1) != 0) || ((bool)local_526)) {
      LookupWrapper::values((LookupWrapper *)0x5a0359);
      iVar9 = 0x10;
      Lib::Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_>::Stack
                (in_stack_fffffffffffffaa8,(size_t)in_stack_fffffffffffffaa0);
      for (iVar8 = 0; local_524 = iVar9, iVar8 <= iVar9; iVar8 = iVar8 + 1) {
        Lib::Stack<Shell::Options::AbstractOptionValue_*>::Stack
                  ((Stack<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffffaa8,
                   (size_t)in_stack_fffffffffffffaa0);
        Lib::Stack<Shell::Options::AbstractOptionValue_*>::Stack
                  ((Stack<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffffaa8,
                   (Stack<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffffa98);
        Lib::Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_>::push
                  ((Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_> *)
                   in_stack_fffffffffffffa98,in_stack_fffffffffffffaa0);
        Lib::Stack<Shell::Options::AbstractOptionValue_*>::~Stack(in_stack_fffffffffffffaa0);
        Lib::Stack<Shell::Options::AbstractOptionValue_*>::~Stack(in_stack_fffffffffffffaa0);
      }
      while (bVar1 = Lib::VirtualIterator<Shell::Options::AbstractOptionValue_*>::hasNext
                               ((VirtualIterator<Shell::Options::AbstractOptionValue_*> *)0x5a044a),
            bVar1) {
        pAVar7 = Lib::VirtualIterator<Shell::Options::AbstractOptionValue_*>::next
                           ((VirtualIterator<Shell::Options::AbstractOptionValue_*> *)0x5a045f);
        bVar1 = AbstractOptionValue::inMode(in_stack_fffffffffffffa98,AXIOM_SELECTION);
        if ((bVar1) &&
           ((((local_526 & 1) != 0 && ((pAVar7->experimental & 1U) != 0)) ||
            (((local_525 & 1) != 0 && ((pAVar7->experimental & 1U) == 0)))))) {
          OVar3 = AbstractOptionValue::getTag(pAVar7);
          Lib::Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_>::operator[]
                    (&local_488,(ulong)OVar3);
          Lib::Stack<Shell::Options::AbstractOptionValue_*>::push
                    ((Stack<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffffa98,
                     (AbstractOptionValue *)0x5a04cc);
        }
      }
      for (; -1 < local_524; local_524 = local_524 + -1) {
        this_00 = Lib::Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_>::operator[]
                            (&local_488,(long)local_524);
        bVar1 = Lib::Stack<Shell::Options::AbstractOptionValue_*>::isEmpty(this_00);
        if (!bVar1) {
          OptionChoiceValues::operator[][abi_cxx11_
                    ((OptionChoiceValues *)in_stack_fffffffffffffaa0,
                     (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
          std::operator+(local_3a8,"  ",&local_3c8);
          std::operator+(&local_4a8,local_3a8,"  ");
          std::__cxx11::string::~string((string *)local_3a8);
          std::__cxx11::string::~string((string *)&local_3c8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stack0xfffffffffffffb30,"******************************",&local_527)
          ;
          std::allocator<char>::~allocator(&local_527);
          std::__cxx11::string::length();
          std::__cxx11::string::length();
          std::__cxx11::string::substr((ulong)local_408,(ulong)&stack0xfffffffffffffb30);
          poVar4 = (ostream *)
                   std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<(poVar4,(string *)&stack0xfffffffffffffb30);
          std::operator<<(poVar4,(string *)&stack0xfffffffffffffb30);
          uVar5 = std::__cxx11::string::length();
          if ((uVar5 & 1) == 0) {
            std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>);
          }
          else {
            poVar4 = std::operator<<(in_RSI,"*");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          }
          poVar4 = std::operator<<(in_RSI,local_408);
          poVar4 = std::operator<<(poVar4,(string *)&local_4a8);
          poVar4 = std::operator<<(poVar4,local_408);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          poVar4 = std::operator<<(in_RSI,(string *)&stack0xfffffffffffffb30);
          std::operator<<(poVar4,(string *)&stack0xfffffffffffffb30);
          uVar5 = std::__cxx11::string::length();
          if ((uVar5 & 1) == 0) {
            pvVar6 = (void *)std::ostream::operator<<(in_RSI,std::endl<char,std::char_traits<char>>)
            ;
            std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          }
          else {
            poVar4 = std::operator<<(in_RSI,"*");
            pvVar6 = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>)
            ;
            std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
          }
          Lib::Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_>::operator[]
                    (&local_488,(long)local_524);
          Lib::Stack<Shell::Options::AbstractOptionValue_*>::Stack
                    ((Stack<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffffaa8,
                     (Stack<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffffa98);
          Lib::DArray<Shell::Options::AbstractOptionValue_*>::DArray
                    ((DArray<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffffaa8,
                     (size_t)in_stack_fffffffffffffa98);
          Lib::Stack<Shell::Options::AbstractOptionValue_*>::Iterator::Iterator
                    ((Iterator *)in_stack_fffffffffffffaa0,
                     (Stack<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffffa98);
          it.super_RefIterator._stack =
               (Stack<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffffaa8;
          it.super_RefIterator._pointer = (AbstractOptionValue **)in_stack_fffffffffffffaa0;
          Lib::DArray<Shell::Options::AbstractOptionValue*>::
          initFromIterator<Lib::Stack<Shell::Options::AbstractOptionValue*>::Iterator>
                    ((DArray<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffffab0,it,
                     0x5a0867);
          Lib::DArray<Shell::Options::AbstractOptionValue_*>::
          sort<Shell::Options::AbstractOptionValueCompatator>
                    ((DArray<Shell::Options::AbstractOptionValue_*> *)&stack0xfffffffffffffb18);
          Lib::DArray<Shell::Options::AbstractOptionValue_*>::Iterator::Iterator
                    (local_448,
                     (DArray<Shell::Options::AbstractOptionValue_*> *)&stack0xfffffffffffffb18);
          while (bVar1 = Lib::DArray<Shell::Options::AbstractOptionValue_*>::Iterator::hasNext
                                   (local_448), bVar1) {
            pAVar7 = Lib::DArray<Shell::Options::AbstractOptionValue_*>::Iterator::next(local_448);
            bVar1 = lineWrapInShowOptions(in_RDI);
            (*pAVar7->_vptr_AbstractOptionValue[7])(pAVar7,in_RSI,(ulong)bVar1);
          }
          Lib::DArray<Shell::Options::AbstractOptionValue_*>::~DArray
                    ((DArray<Shell::Options::AbstractOptionValue_*> *)in_stack_fffffffffffffa98);
          Lib::Stack<Shell::Options::AbstractOptionValue_*>::~Stack(in_stack_fffffffffffffaa0);
          std::__cxx11::string::~string(local_408);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffb30);
          std::__cxx11::string::~string((string *)&local_4a8);
        }
      }
      Lib::Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_>::~Stack
                ((Stack<Lib::Stack<Shell::Options::AbstractOptionValue_*>_> *)
                 in_stack_fffffffffffffa98);
      Lib::VirtualIterator<Shell::Options::AbstractOptionValue_*>::~VirtualIterator
                ((VirtualIterator<Shell::Options::AbstractOptionValue_*> *)0x5a09b2);
    }
  }
  return;
}

Assistant:

void Options::output (std::ostream& str) const
{
  if(printAllTheoryAxioms()){
    cout << "Sorry, not implemented yet!" << endl;

    return;
  }

  if(!explainOption().empty()){
     AbstractOptionValue* option;
     std::string name = explainOption();
     try{
       option = _lookup.findLong(name);
     }
     catch(const ValueNotFoundException&){ 
       try{
         option = _lookup.findShort(name);
       }
       catch(const ValueNotFoundException&){
         option = 0;
       }
     }
     if(!option){ 
       str << name << " not a known option" << endl;
       Stack<std::string> sim_s = getSimilarOptionNames(name,true);
       Stack<std::string> sim_l = getSimilarOptionNames(name,false);
       VirtualIterator<std::string> sit = pvi(concatIters(
           Stack<std::string>::Iterator(sim_s),Stack<std::string>::Iterator(sim_l))); 
        if(sit.hasNext()){
          std::string first = sit.next();
          str << "\tMaybe you meant ";
          if(sit.hasNext()) str << "one of:\n\t\t";
          str << first;
          while(sit.hasNext()){ str << "\n\t\t"+sit.next();}
          str << endl;
        }
     }
     else{
       std::stringstream vs;
       option->output(vs,lineWrapInShowOptions());
       str << vs.str();
     }

  }

  if (showHelp()){
    str << "=========== Usage ==========\n";
    str << "Call vampire using\n";
    str << "  vampire [options] [problem]\n";
    str << "For example,\n";
    str << "  vampire --mode casc --include ~/TPTP ~/TPTP/Problems/ALG/ALG150+1.p\n";

    str << "=========== Hints ==========\n";


    str << "=========== Options ==========\n";
    str << "To see a list of all options use\n  --show_options on\n";
    str << "Options will only be displayed for the current mode (Vampire by default)\n";
    str << " use --mode to change mode\n";
    //str << "By default experimental options will not be shown. To show ";
    //str << "these options use\n  --show_experimental_options on\n";
    str << "=========== End ==========\n";
  }

  bool normalshow = showOptions();
  bool experimental = showExperimentalOptions();

  if(normalshow || experimental) {
    Mode this_mode = _mode.actualValue;
    //str << "=========== Options ==========\n";

    VirtualIterator<AbstractOptionValue*> options = _lookup.values();

    int num_tags = static_cast<int>(OptionTag::LAST_TAG);
    Stack<Stack<AbstractOptionValue*>> groups;
    for(int i=0; i<=num_tags;i++){
        Stack<AbstractOptionValue*> stack;
        groups.push(stack);
    }


    while(options.hasNext()){
      AbstractOptionValue* option = options.next();
      if(option->inMode(this_mode) &&
              ((experimental && option->experimental) ||
               (normalshow && !option->experimental) )){
        unsigned tag = static_cast<unsigned>(option->getTag());
        //option->output(*groups[tag]);
        (groups[tag]).push(option);
      }
    }

    //output them in reverse order
    for(int i=num_tags;i>=0;i--){
      if(groups[i].isEmpty()) continue;
      std::string label = "  "+_tagNames[i]+"  ";
      ASS(label.length() < 40);
      std::string br = "******************************";
      std::string br_gap = br.substr(0,(br.length()-(label.length()/2)));
      str << endl << br << br;
      if (label.length() % 2 == 0) {
        str << endl;
      } else {
        str << "*" << endl;
      }
      str << br_gap << label << br_gap << endl;
      str << br << br;
      if (label.length() % 2 == 0) {
        str << endl << endl;
      } else {
        str << "*" << endl << endl;
      }

      // Sort
      Stack<AbstractOptionValue*> os = groups[i];
      DArray<AbstractOptionValue*> osa;
      osa.initFromIterator(Stack<AbstractOptionValue*>::Iterator(os));
      osa.sort(AbstractOptionValueCompatator());
      DArray<AbstractOptionValue*>::Iterator oit(osa);
      while(oit.hasNext()){
        oit.next()->output(str,lineWrapInShowOptions());
      }
      //str << (*groups[i]).str();
      //delete groups[i];
    }

    //str << "======= End of options =======\n";
  }

}